

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFFFundamentalParameterData.h
# Opt level: O0

void __thiscall
DIS::IFFFundamentalParameterData::IFFFundamentalParameterData
          (IFFFundamentalParameterData *this,IFFFundamentalParameterData *param_1)

{
  float fVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  IFFFundamentalParameterData *param_1_local;
  IFFFundamentalParameterData *this_local;
  
  this->_vptr_IFFFundamentalParameterData = (_func_int **)&PTR__IFFFundamentalParameterData_00267e18
  ;
  fVar1 = param_1->_frequency;
  this->_erp = param_1->_erp;
  this->_frequency = fVar1;
  fVar1 = param_1->_pulseWidth;
  this->_pgrf = param_1->_pgrf;
  this->_pulseWidth = fVar1;
  uVar2 = param_1->_applicableModes;
  uVar3 = param_1->_systemSpecificData[0];
  uVar4 = param_1->_systemSpecificData[1];
  uVar5 = param_1->_systemSpecificData[2];
  this->_burstLength = param_1->_burstLength;
  this->_applicableModes = uVar2;
  this->_systemSpecificData[0] = uVar3;
  this->_systemSpecificData[1] = uVar4;
  this->_systemSpecificData[2] = uVar5;
  return;
}

Assistant:

class OPENDIS7_EXPORT IFFFundamentalParameterData
{
protected:
  /** ERP */
  float _erp; 

  /** frequency */
  float _frequency; 

  /** pgrf */
  float _pgrf; 

  /** Pulse width */
  float _pulseWidth; 

  /** Burst length */
  unsigned int _burstLength; 

  /** Applicable modes enumeration */
  unsigned char _applicableModes; 

  /** System-specific data */
  unsigned char _systemSpecificData[3]; 


 public:
    IFFFundamentalParameterData();
    virtual ~IFFFundamentalParameterData();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    float getErp() const; 
    void setErp(float pX); 

    float getFrequency() const; 
    void setFrequency(float pX); 

    float getPgrf() const; 
    void setPgrf(float pX); 

    float getPulseWidth() const; 
    void setPulseWidth(float pX); 

    unsigned int getBurstLength() const; 
    void setBurstLength(unsigned int pX); 

    unsigned char getApplicableModes() const; 
    void setApplicableModes(unsigned char pX); 

    unsigned char*  getSystemSpecificData(); 
    const unsigned char*  getSystemSpecificData() const; 
    void setSystemSpecificData( const unsigned char*    pX);


virtual int getMarshalledSize() const;

     bool operator  ==(const IFFFundamentalParameterData& rhs) const;
}